

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void output_features(io_buf *cache,uchar index,features *fs,uint64_t mask)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  float *__begin1;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  uint64_t i;
  long lVar8;
  v_array<float> *__range1;
  ulong *puVar9;
  float *local_40;
  io_buf *local_38;
  
  pfVar5 = (fs->values)._begin;
  pfVar2 = (fs->values)._end;
  lVar7 = ((long)pfVar2 - (long)pfVar5 >> 2) * 0xb;
  for (; pfVar5 != pfVar2; pfVar5 = pfVar5 + 1) {
    fVar1 = *pfVar5;
    lVar8 = lVar7;
    if (fVar1 != -1.0) {
      lVar8 = lVar7 + 4;
    }
    if (NAN(fVar1)) {
      lVar8 = lVar7 + 4;
    }
    if (fVar1 != 1.0) {
      lVar7 = lVar8;
    }
    if (NAN(fVar1)) {
      lVar7 = lVar8;
    }
  }
  local_38 = cache;
  io_buf::buf_write(cache,(char **)&local_40,lVar7 + 9);
  pfVar4 = local_40;
  *(uchar *)local_40 = index;
  local_40 = (float *)((long)local_40 + 9);
  pfVar5 = (fs->values)._begin;
  pfVar2 = (fs->values)._end;
  puVar9 = (fs->indicies)._begin;
  uVar6 = 0;
  do {
    if (pfVar5 == pfVar2) {
      local_38->head = (char *)local_40;
      *(long *)((long)pfVar4 + 1) = (long)local_40 + (-8 - (long)((long)pfVar4 + 1));
      return;
    }
    uVar3 = *puVar9;
    lVar7 = (uVar3 & mask) - uVar6;
    i = lVar7 >> 0x3d & 0xfffffffffffffffcU ^ lVar7 * 8;
    fVar1 = *pfVar5;
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      if ((fVar1 == -1.0) && (!NAN(fVar1))) {
        i = i | 1;
        goto LAB_0021f0b0;
      }
      local_40 = (float *)run_len_encode((char *)local_40,i | 2);
      *local_40 = *pfVar5;
      local_40 = local_40 + 1;
    }
    else {
LAB_0021f0b0:
      local_40 = (float *)run_len_encode((char *)local_40,i);
    }
    pfVar5 = pfVar5 + 1;
    puVar9 = puVar9 + 1;
    uVar6 = uVar3 & mask;
  } while( true );
}

Assistant:

void output_features(io_buf& cache, unsigned char index, features& fs, uint64_t mask)
{
  char* c;
  size_t storage = fs.size() * int_size;
  for (feature_value f : fs.values)
    if (f != 1. && f != -1.)
      storage += sizeof(feature_value);

  cache.buf_write(c, sizeof(index) + storage + sizeof(size_t));
  *reinterpret_cast<unsigned char*>(c) = index;
  c += sizeof(index);

  char* storage_size_loc = c;
  c += sizeof(size_t);

  uint64_t last = 0;
  for (features::iterator& f : fs)
  {
    feature_index fi = f.index() & mask;
    int64_t s_diff = (fi - last);
    uint64_t diff = ZigZagEncode(s_diff) << 2;
    last = fi;

    if (f.value() == 1.)
      c = run_len_encode(c, diff);
    else if (f.value() == -1.)
      c = run_len_encode(c, diff | neg_1);
    else
    {
      c = run_len_encode(c, diff | general);
      memcpy(c, &f.value(), sizeof(feature_value));
      c += sizeof(feature_value);
    }
  }

  cache.set(c);
  *(size_t*)storage_size_loc = c - storage_size_loc - sizeof(size_t);
}